

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O0

void __thiscall TileSwitch::updateOutput(TileSwitch *this)

{
  uint uVar1;
  Vector2u *pVVar2;
  Board *pBVar3;
  Tile *pTVar4;
  Tile *in_RDI;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
  *in_stack_ffffffffffffff90;
  Vector2<unsigned_int> local_30;
  Vector2<unsigned_int> local_28;
  Vector2<unsigned_int> local_20;
  Vector2<unsigned_int> local_18 [3];
  
  Tile::getBoardPtr(in_RDI);
  std::
  unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
  ::erase(in_stack_ffffffffffffff90,
          (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pVVar2 = Tile::getPosition(in_RDI);
  if (pVVar2->y != 0) {
    pBVar3 = Tile::getBoardPtr(in_RDI);
    pVVar2 = Tile::getPosition(in_RDI);
    uVar1 = pVVar2->x;
    pVVar2 = Tile::getPosition(in_RDI);
    sf::Vector2<unsigned_int>::Vector2(local_18,uVar1,pVVar2->y - 1);
    pTVar4 = Board::getTile(pBVar3,local_18);
    (*pTVar4->_vptr_Tile[9])(pTVar4,0,(ulong)*(uint *)&in_RDI->field_0x24);
  }
  pVVar2 = Tile::getPosition(in_RDI);
  uVar1 = pVVar2->x;
  pBVar3 = Tile::getBoardPtr(in_RDI);
  pVVar2 = Board::getSize(pBVar3);
  if (uVar1 < pVVar2->x - 1) {
    pBVar3 = Tile::getBoardPtr(in_RDI);
    pVVar2 = Tile::getPosition(in_RDI);
    uVar1 = pVVar2->x;
    pVVar2 = Tile::getPosition(in_RDI);
    sf::Vector2<unsigned_int>::Vector2(&local_20,uVar1 + 1,pVVar2->y);
    pTVar4 = Board::getTile(pBVar3,&local_20);
    (*pTVar4->_vptr_Tile[9])(pTVar4,1,(ulong)*(uint *)&in_RDI->field_0x24);
  }
  pVVar2 = Tile::getPosition(in_RDI);
  uVar1 = pVVar2->y;
  pBVar3 = Tile::getBoardPtr(in_RDI);
  pVVar2 = Board::getSize(pBVar3);
  if (uVar1 < pVVar2->y - 1) {
    pBVar3 = Tile::getBoardPtr(in_RDI);
    pVVar2 = Tile::getPosition(in_RDI);
    uVar1 = pVVar2->x;
    pVVar2 = Tile::getPosition(in_RDI);
    sf::Vector2<unsigned_int>::Vector2(&local_28,uVar1,pVVar2->y + 1);
    pTVar4 = Board::getTile(pBVar3,&local_28);
    (*pTVar4->_vptr_Tile[9])(pTVar4,2,(ulong)*(uint *)&in_RDI->field_0x24);
  }
  pVVar2 = Tile::getPosition(in_RDI);
  if (pVVar2->x != 0) {
    pBVar3 = Tile::getBoardPtr(in_RDI);
    pVVar2 = Tile::getPosition(in_RDI);
    uVar1 = pVVar2->x - 1;
    pVVar2 = Tile::getPosition(in_RDI);
    sf::Vector2<unsigned_int>::Vector2(&local_30,uVar1,pVVar2->y);
    pTVar4 = Board::getTile(pBVar3,&local_30);
    (*pTVar4->_vptr_Tile[9])(pTVar4,3,(ulong)*(uint *)&in_RDI->field_0x24);
  }
  return;
}

Assistant:

void TileSwitch::updateOutput() {
    getBoardPtr()->switchUpdates.erase(this);
    
    if (getPosition().y > 0) {    // Follow wire on all adjacent sides.
        getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1))->followWire(NORTH, _state);
    }
    if (getPosition().x < getBoardPtr()->getSize().x - 1) {
        getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y))->followWire(EAST, _state);
    }
    if (getPosition().y < getBoardPtr()->getSize().y - 1) {
        getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1))->followWire(SOUTH, _state);
    }
    if (getPosition().x > 0) {
        getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y))->followWire(WEST, _state);
    }
}